

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

void QtPrivate::q_relocate_overlap_n_left_move<std::reverse_iterator<LibrarySearchPath*>,long_long>
               (reverse_iterator<LibrarySearchPath_*> first,longlong n,
               reverse_iterator<LibrarySearchPath_*> d_first)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  int *piVar4;
  LibrarySearchPath *pLVar5;
  LibrarySearchPath *pLVar6;
  LibrarySearchPath *pLVar7;
  LibrarySearchPath *pLVar8;
  long in_FS_OFFSET;
  Destructor local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.end.current =
       (LibrarySearchPath *)((d_first.current)->super_QMakeLocalFileName).real_name.d.d;
  pLVar5 = local_38.end.current + -n;
  pLVar8 = (LibrarySearchPath *)((first.current)->super_QMakeLocalFileName).real_name.d.d;
  local_38.intermediate.current = local_38.end.current;
  pLVar6 = pLVar5;
  pLVar7 = pLVar8;
  if (pLVar5 < pLVar8) {
    pLVar6 = pLVar8;
    pLVar7 = pLVar5;
  }
  while (local_38.intermediate.current != pLVar6) {
    pDVar1 = pLVar8[-1].super_QMakeLocalFileName.real_name.d.d;
    pLVar8[-1].super_QMakeLocalFileName.real_name.d.d = (Data *)0x0;
    local_38.intermediate.current[-1].super_QMakeLocalFileName.real_name.d.d = pDVar1;
    pcVar2 = pLVar8[-1].super_QMakeLocalFileName.real_name.d.ptr;
    pLVar8[-1].super_QMakeLocalFileName.real_name.d.ptr = (char16_t *)0x0;
    local_38.intermediate.current[-1].super_QMakeLocalFileName.real_name.d.ptr = pcVar2;
    qVar3 = pLVar8[-1].super_QMakeLocalFileName.real_name.d.size;
    pLVar8[-1].super_QMakeLocalFileName.real_name.d.size = 0;
    local_38.intermediate.current[-1].super_QMakeLocalFileName.real_name.d.size = qVar3;
    pDVar1 = pLVar8[-1].super_QMakeLocalFileName.local_name.d.d;
    pLVar8[-1].super_QMakeLocalFileName.local_name.d.d = (Data *)0x0;
    local_38.intermediate.current[-1].super_QMakeLocalFileName.local_name.d.d = pDVar1;
    pcVar2 = pLVar8[-1].super_QMakeLocalFileName.local_name.d.ptr;
    pLVar8[-1].super_QMakeLocalFileName.local_name.d.ptr = (char16_t *)0x0;
    local_38.intermediate.current[-1].super_QMakeLocalFileName.local_name.d.ptr = pcVar2;
    qVar3 = pLVar8[-1].super_QMakeLocalFileName.local_name.d.size;
    pLVar8[-1].super_QMakeLocalFileName.local_name.d.size = 0;
    local_38.intermediate.current[-1].super_QMakeLocalFileName.local_name.d.size = qVar3;
    local_38.intermediate.current[-1]._default = pLVar8[-1]._default;
    ((d_first.current)->super_QMakeLocalFileName).real_name.d.d =
         (Data *)&((d_first.current)->super_QMakeLocalFileName).real_name.d.d[-4].super_QArrayData.
                  alloc;
    pLVar8 = (LibrarySearchPath *)
             &((first.current)->super_QMakeLocalFileName).real_name.d.d[-4].super_QArrayData.alloc;
    ((first.current)->super_QMakeLocalFileName).real_name.d.d = (Data *)pLVar8;
    local_38.intermediate.current =
         (LibrarySearchPath *)((d_first.current)->super_QMakeLocalFileName).real_name.d.d;
  }
  local_38.iter = &local_38.end;
  pLVar6 = local_38.intermediate.current;
  while (pLVar6 != pLVar5) {
    pDVar1 = pLVar6[-1].super_QMakeLocalFileName.real_name.d.d;
    pLVar6[-1].super_QMakeLocalFileName.real_name.d.d =
         pLVar8[-1].super_QMakeLocalFileName.real_name.d.d;
    pLVar8[-1].super_QMakeLocalFileName.real_name.d.d = pDVar1;
    pcVar2 = pLVar6[-1].super_QMakeLocalFileName.real_name.d.ptr;
    pLVar6[-1].super_QMakeLocalFileName.real_name.d.ptr =
         pLVar8[-1].super_QMakeLocalFileName.real_name.d.ptr;
    pLVar8[-1].super_QMakeLocalFileName.real_name.d.ptr = pcVar2;
    qVar3 = pLVar6[-1].super_QMakeLocalFileName.real_name.d.size;
    pLVar6[-1].super_QMakeLocalFileName.real_name.d.size =
         pLVar8[-1].super_QMakeLocalFileName.real_name.d.size;
    pLVar8[-1].super_QMakeLocalFileName.real_name.d.size = qVar3;
    pDVar1 = pLVar6[-1].super_QMakeLocalFileName.local_name.d.d;
    pLVar6[-1].super_QMakeLocalFileName.local_name.d.d =
         pLVar8[-1].super_QMakeLocalFileName.local_name.d.d;
    pLVar8[-1].super_QMakeLocalFileName.local_name.d.d = pDVar1;
    pcVar2 = pLVar6[-1].super_QMakeLocalFileName.local_name.d.ptr;
    pLVar6[-1].super_QMakeLocalFileName.local_name.d.ptr =
         pLVar8[-1].super_QMakeLocalFileName.local_name.d.ptr;
    pLVar8[-1].super_QMakeLocalFileName.local_name.d.ptr = pcVar2;
    qVar3 = pLVar6[-1].super_QMakeLocalFileName.local_name.d.size;
    pLVar6[-1].super_QMakeLocalFileName.local_name.d.size =
         pLVar8[-1].super_QMakeLocalFileName.local_name.d.size;
    pLVar8[-1].super_QMakeLocalFileName.local_name.d.size = qVar3;
    pLVar6[-1]._default = pLVar8[-1]._default;
    ((d_first.current)->super_QMakeLocalFileName).real_name.d.d =
         (Data *)&((d_first.current)->super_QMakeLocalFileName).real_name.d.d[-4].super_QArrayData.
                  alloc;
    pLVar8 = (LibrarySearchPath *)
             &((first.current)->super_QMakeLocalFileName).real_name.d.d[-4].super_QArrayData.alloc;
    ((first.current)->super_QMakeLocalFileName).real_name.d.d = (Data *)pLVar8;
    pLVar6 = (LibrarySearchPath *)((d_first.current)->super_QMakeLocalFileName).real_name.d.d;
  }
  while (pLVar8 != pLVar7) {
    ((first.current)->super_QMakeLocalFileName).real_name.d.d = (Data *)(pLVar8 + 1);
    pDVar1 = (pLVar8->super_QMakeLocalFileName).local_name.d.d;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate
                  (&((pLVar8->super_QMakeLocalFileName).local_name.d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar4 = *(int **)&(pLVar8->super_QMakeLocalFileName).real_name.d.d;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate
                  (*(QArrayData **)&(pLVar8->super_QMakeLocalFileName).real_name.d.d,2,0x10);
      }
    }
    pLVar8 = (LibrarySearchPath *)((first.current)->super_QMakeLocalFileName).real_name.d.d;
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<LibrarySearchPath_*>,_long_long>::Destructor
  ::~Destructor(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}